

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  uint uVar1;
  sqlite3 *db;
  char *zArg3;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  Table *pTable;
  VTable *pVVar5;
  Vdbe *pVVar6;
  long lVar7;
  Schema **ppSVar8;
  char *pcVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  
  db = pParse->db;
  if (db->mallocFailed != '\0') goto LAB_0017a389;
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + '\x01';
  }
  pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + 0xff;
  }
  if (pTable == (Table *)0x0) {
    if (noErr != 0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
    }
    goto LAB_0017a389;
  }
  if (pTable->pSchema == (Schema *)0x0) {
    uVar12 = 0xfff0bdc0;
  }
  else {
    uVar1 = db->nDb;
    if ((int)uVar1 < 1) {
      uVar12 = 0;
    }
    else {
      ppSVar8 = &db->aDb->pSchema;
      uVar12 = 0;
      do {
        if (*ppSVar8 == pTable->pSchema) goto LAB_0017a42d;
        uVar12 = uVar12 + 1;
        ppSVar8 = ppSVar8 + 4;
      } while (uVar1 != uVar12);
      uVar12 = (ulong)uVar1;
    }
  }
LAB_0017a42d:
  if (((pTable->tabFlags & 0x10) != 0) &&
     (iVar3 = sqlite3ViewGetColumnNames(pParse,pTable), iVar3 != 0)) goto LAB_0017a389;
  iVar3 = (int)uVar12;
  pcVar9 = "sqlite_master";
  if (iVar3 == 1) {
    pcVar9 = "sqlite_temp_master";
  }
  zArg3 = db->aDb[iVar3].zName;
  iVar4 = sqlite3AuthCheck(pParse,9,pcVar9,(char *)0x0,zArg3);
  if (iVar4 != 0) goto LAB_0017a389;
  if (isView == 0) {
    if ((pTable->tabFlags & 0x10) == 0) {
      iVar4 = (uint)(iVar3 == 1) * 2 + 0xb;
      goto LAB_0017a4bd;
    }
    for (pVVar5 = pTable->pVTable; (pVVar5 != (VTable *)0x0 && (pVVar5->db != db));
        pVVar5 = pVVar5->pNext) {
    }
    pcVar9 = pVVar5->pMod->zName;
    iVar4 = 0x1e;
  }
  else {
    iVar4 = (uint)(iVar3 != 1) * 2 + 0xf;
LAB_0017a4bd:
    pcVar9 = (char *)0x0;
  }
  iVar4 = sqlite3AuthCheck(pParse,iVar4,pTable->zName,pcVar9,zArg3);
  if ((iVar4 != 0) ||
     (iVar4 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,zArg3), iVar4 != 0))
  goto LAB_0017a389;
  pbVar2 = (byte *)pTable->zName;
  lVar7 = 7;
  lVar11 = 0;
  pcVar9 = "sqlite_";
  pbVar10 = pbVar2;
  do {
    if ((ulong)*pbVar10 == 0) {
      pcVar9 = "sqlite_" + lVar11;
      goto LAB_0017a57f;
    }
    if (""[*pbVar10] != ""[(byte)*pcVar9]) goto LAB_0017a57f;
    pbVar10 = pbVar10 + 1;
    lVar11 = lVar11 + 1;
    pcVar9 = (char *)((byte *)pcVar9 + 1);
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  lVar7 = 0;
  pcVar9 = (char *)(byte *)0x1ac320;
  pbVar10 = pbVar2 + 7;
LAB_0017a57f:
  if (((int)lVar7 < 1) || (""[*pbVar10] == ""[(byte)*pcVar9])) {
    lVar7 = 0xb;
    lVar11 = 0;
    pcVar9 = "sqlite_stat";
    pbVar10 = pbVar2;
    do {
      if ((ulong)*pbVar10 == 0) {
        pcVar9 = "sqlite_stat" + lVar11;
        goto LAB_0017a5ea;
      }
      if (""[*pbVar10] != ""[(byte)*pcVar9]) goto LAB_0017a5ea;
      pbVar10 = pbVar10 + 1;
      lVar11 = lVar11 + 1;
      pcVar9 = (char *)((byte *)pcVar9 + 1);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    lVar7 = 0;
    pbVar10 = pbVar2 + 0xb;
    pcVar9 = (char *)(byte *)0x1acbc6;
LAB_0017a5ea:
    if (((int)lVar7 < 1) || (""[*pbVar10] == ""[(byte)*pcVar9])) goto LAB_0017a600;
    pcVar9 = "table %s may not be dropped";
  }
  else {
LAB_0017a600:
    if (isView == 0) {
      if (pTable->pSelect == (Select *)0x0) goto LAB_0017a628;
      pcVar9 = "use DROP VIEW to delete view %s";
    }
    else {
      if (pTable->pSelect != (Select *)0x0) {
LAB_0017a628:
        pVVar6 = sqlite3GetVdbe(pParse);
        if (pVVar6 != (Vdbe *)0x0) {
          sqlite3BeginWriteOperation(pParse,1,iVar3);
          sqlite3ClearStatTables(pParse,iVar3,"tbl",pTable->zName);
          sqlite3FkDropTable(pParse,pName,pTable);
          sqlite3CodeDropTable(pParse,pTable,iVar3,isView);
        }
        goto LAB_0017a389;
      }
      pcVar9 = "use DROP TABLE to delete table %s";
    }
  }
  sqlite3ErrorMsg(pParse,pcVar9,pbVar2);
LAB_0017a389:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( noErr ) db->suppressErr++;
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ) sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
    && sqlite3StrNICmp(pTab->zName, "sqlite_stat", 11)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && pTab->pSelect==0 ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the master table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
    sqlite3FkDropTable(pParse, pName, pTab);
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}